

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

void __thiscall
SimpleAsciiFixture_IndexStdString_Test::TestBody(SimpleAsciiFixture_IndexStdString_Test *this)

{
  char *pcVar1;
  size_t start_count;
  AssertionResult gtest_ar;
  const_iterator end;
  const_iterator it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  pcVar1 = (anonymous_namespace)::SimpleAsciiFixture::str_abi_cxx11_;
  local_28._M_current = (anonymous_namespace)::SimpleAsciiFixture::str_abi_cxx11_ + DAT_00234c08;
  local_20._M_current = (anonymous_namespace)::SimpleAsciiFixture::str_abi_cxx11_;
  local_48._M_current = (char *)0x0;
  local_48 = std::
             __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                       ((anonymous_namespace)::SimpleAsciiFixture::str_abi_cxx11_,
                        local_28._M_current,&local_48,0);
  testing::internal::
  CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (local_38,"it","pstore::utf::index (begin, end, 0)",&local_20,&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x51,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
  }
  else {
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_20._M_current = local_20._M_current + 1;
    local_48._M_current = (char *)0x0;
    local_48 = std::
               __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                         (pcVar1,local_28._M_current,&local_48,1);
    testing::internal::
    CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (local_38,"it","pstore::utf::index (begin, end, 1)",&local_20,&local_48);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                 ,0x53,pcVar1);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    }
    else {
      if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_30,local_30);
      }
      local_20._M_current = local_20._M_current + 1;
      local_48._M_current = (char *)0x0;
      local_48 = std::
                 __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                           (pcVar1,local_28._M_current,&local_48,2);
      testing::internal::
      CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (local_38,"it","pstore::utf::index (begin, end, 2)",&local_20,&local_48);
      if (local_38[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = (local_30->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                   ,0x55,pcVar1);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      }
      else {
        if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_30,local_30);
        }
        local_20._M_current = local_20._M_current + 1;
        local_48._M_current = (char *)0x0;
        local_48 = std::
                   __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                             (pcVar1,local_28._M_current,&local_48,3);
        testing::internal::
        CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (local_38,"it","pstore::utf::index (begin, end, 3)",&local_20,&local_48);
        if (local_38[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar1 = "";
          }
          else {
            pcVar1 = (local_30->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                     ,0x57,pcVar1);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
        }
        else {
          if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_30,local_30);
          }
          local_20._M_current = local_20._M_current + 1;
          local_48._M_current = (char *)0x0;
          local_48 = std::
                     __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                               (pcVar1,local_28._M_current,&local_48,4);
          testing::internal::
          CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (local_38,"it","pstore::utf::index (begin, end, 4)",&local_20,&local_48);
          if (local_38[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar1 = "";
            }
            else {
              pcVar1 = (local_30->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_40,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                       ,0x59,pcVar1);
            testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
          }
          else {
            if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_30,local_30);
            }
            local_20._M_current = local_20._M_current + 1;
            local_48._M_current = (char *)0x0;
            local_48 = std::
                       __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                                 (pcVar1,local_28._M_current,&local_48,5);
            testing::internal::
            CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (local_38,"it","pstore::utf::index (begin, end, 5)",&local_20,&local_48);
            if (local_38[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_48);
              if (local_30 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = (local_30->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_40,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                         ,0x5b,pcVar1);
              testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
            }
            else {
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              local_20._M_current = local_20._M_current + 1;
              local_48._M_current = (char *)0x0;
              local_48 = std::
                         __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                                   (pcVar1,local_28._M_current,&local_48,6);
              testing::internal::
              CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (local_38,"it","pstore::utf::index (begin, end, 6)",&local_20,&local_48);
              if (local_38[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_48);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_40,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                           ,0x5d,pcVar1);
                testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
              }
              else {
                if (local_30 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_30,local_30);
                }
                local_20._M_current = local_20._M_current + 1;
                local_48._M_current = (char *)0x0;
                local_48 = std::
                           __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                                     (pcVar1,local_28._M_current,&local_48,7);
                testing::internal::
                CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (local_38,"it","pstore::utf::index (begin, end, 7)",&local_20,&local_48);
                if (local_38[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_48);
                  if (local_30 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar1 = "";
                  }
                  else {
                    pcVar1 = (local_30->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                             ,0x5f,pcVar1);
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
                }
                else {
                  if (local_30 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_30,local_30);
                  }
                  local_20._M_current = local_20._M_current + 1;
                  local_48._M_current = (char *)0x0;
                  local_48 = std::
                             __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                                       (pcVar1,local_28._M_current,&local_48,8);
                  testing::internal::
                  CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            (local_38,"it","pstore::utf::index (begin, end, 8)",&local_20,&local_48)
                  ;
                  if (local_38[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_48);
                    if (local_30 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar1 = "";
                    }
                    else {
                      pcVar1 = (local_30->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_40,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                               ,0x61,pcVar1);
                    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
                  }
                  else {
                    if (local_30 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_30,local_30);
                    }
                    local_48._M_current = (char *)0x0;
                    local_48 = std::
                               __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                                         (pcVar1,local_28._M_current,&local_48,9);
                    testing::internal::
                    CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (local_38,"end","pstore::utf::index (begin, end, 9)",&local_28,
                               &local_48);
                    if (local_38[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_48);
                      if (local_30 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar1 = "";
                      }
                      else {
                        pcVar1 = (local_30->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_40,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                                 ,99,pcVar1);
                      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
                    }
                    else {
                      if (local_30 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_30,local_30);
                      }
                      local_48._M_current = (char *)0x0;
                      local_48 = std::
                                 __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long)::_lambda(char)_1_>>
                                           (pcVar1,local_28._M_current,&local_48,0xffffffffffffffff)
                      ;
                      testing::internal::
                      CmpHelperEQ<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                (local_38,"end",
                                 "pstore::utf::index (begin, end, std::numeric_limits<std::size_t>::max ())"
                                 ,&local_28,&local_48);
                      if (local_38[0] != (internal)0x0) goto LAB_0019fa05;
                      testing::Message::Message((Message *)&local_48);
                      if (local_30 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar1 = "";
                      }
                      else {
                        pcVar1 = (local_30->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_40,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
                                 ,100,pcVar1);
                      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if ((long *)local_48._M_current != (long *)0x0) {
    (**(code **)(*(long *)local_48._M_current + 8))();
  }
LAB_0019fa05:
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST_F (FourByteUtf8ChineseCharacters, LengthWithNulTerminatedString) {
    ASSERT_EQ (4U, pstore::utf::length (str.c_str (), sizeof (bytes) - 1));
}